

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

int64_t __thiscall
aeron::archive::AeronArchive::getStopPosition(AeronArchive *this,int64_t recordingId)

{
  int64_t iVar1;
  int64_t local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = &local_30;
  local_10 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:292:9)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:292:9)>
             ::_M_manager;
  local_30 = recordingId;
  local_28._M_unused._M_object = this;
  iVar1 = callAndPollForResponse
                    (this,(function<bool_(long)> *)&local_28,"get recording stop position");
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return iVar1;
}

Assistant:

std::int64_t AeronArchive::getStopPosition(std::int64_t recordingId) {
    return callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->getStopPosition(recordingId, correlationId, controlSessionId_);
        },
        "get recording stop position");
}